

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_ffh_string_byte(lua_State *L)

{
  MSize MVar1;
  int32_t iVar2;
  int iVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  ulong uVar7;
  uint uVar8;
  MSize MVar9;
  uint need;
  int iVar10;
  
  iVar2 = 1;
  pGVar4 = lj_lib_checkstr(L,1);
  MVar1 = pGVar4->len;
  pTVar5 = L->base;
  pTVar6 = L->top;
  if ((pTVar5 + 1 < pTVar6) && (*(int *)((long)pTVar5 + 0xc) != -1)) {
    iVar2 = lj_lib_checkint(L,2);
    pTVar5 = L->base;
    pTVar6 = L->top;
  }
  iVar3 = iVar2;
  if ((pTVar5 + 2 < pTVar6) && (*(int *)((long)pTVar5 + 0x14) != -1)) {
    iVar3 = lj_lib_checkint(L,3);
  }
  MVar9 = (iVar3 >> 0x1f & MVar1 + 1) + iVar3;
  iVar3 = (iVar2 >> 0x1f & MVar1 + 1) + iVar2;
  iVar10 = 1;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  if ((int)MVar1 <= (int)MVar9) {
    MVar9 = MVar1;
  }
  if (iVar3 <= (int)MVar9) {
    uVar8 = iVar3 - 1;
    need = MVar9 - uVar8;
    if (8000 < need) {
      lj_err_caller(L,LJ_ERR_STRSLC);
    }
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) <= (long)(ulong)(need * 8)) {
      lj_state_growstack(L,need);
    }
    if (MVar9 != uVar8) {
      uVar7 = 0;
      do {
        L->base[uVar7 - 1].n = (double)*(byte *)((long)&pGVar4[1].nextgc.gcptr32 + uVar7 + uVar8);
        uVar7 = uVar7 + 1;
      } while (need + (need == 0) != uVar7);
    }
    iVar10 = need + 1;
  }
  return iVar10;
}

Assistant:

LJLIB_ASM(string_byte)		LJLIB_REC(string_range 0)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t len = (int32_t)s->len;
  int32_t start = lj_lib_optint(L, 2, 1);
  int32_t stop = lj_lib_optint(L, 3, start);
  int32_t n, i;
  const unsigned char *p;
  if (stop < 0) stop += len+1;
  if (start < 0) start += len+1;
  if (start <= 0) start = 1;
  if (stop > len) stop = len;
  if (start > stop) return FFH_RES(0);  /* Empty interval: return no results. */
  start--;
  n = stop - start;
  if ((uint32_t)n > LUAI_MAXCSTACK)
    lj_err_caller(L, LJ_ERR_STRSLC);
  lj_state_checkstack(L, (MSize)n);
  p = (const unsigned char *)strdata(s) + start;
  for (i = 0; i < n; i++)
    setintV(L->base + i-1, p[i]);
  return FFH_RES(n);
}